

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  ParenthesizedExpressionSyntax *args_5;
  ActionBlockSyntax *args_6;
  ImmediateAssertionStatementSyntax *pIVar1;
  NamedLabelSyntax *local_48;
  Token local_40;
  DeferredAssertionSyntax *local_30;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_48 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_48 = (NamedLabelSyntax *)
               deepClone(*(SyntaxNode **)(__fn + 0x18),(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_30 = (DeferredAssertionSyntax *)0x0;
  }
  else {
    local_30 = (DeferredAssertionSyntax *)
               deepClone(*(SyntaxNode **)(__fn + 0x68),(BumpAllocator *)__child_stack);
  }
  args_5 = (ParenthesizedExpressionSyntax *)
           deepClone(*(SyntaxNode **)(__fn + 0x70),(BumpAllocator *)__child_stack);
  args_6 = (ActionBlockSyntax *)
           deepClone(*(SyntaxNode **)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImmediateAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DeferredAssertionSyntax*,slang::syntax::ParenthesizedExpressionSyntax&,slang::syntax::ActionBlockSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_48,args_2,&local_40,
                      &local_30,args_5,args_6);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImmediateAssertionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImmediateAssertionStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone<ParenthesizedExpressionSyntax>(*node.expr, alloc),
        *deepClone<ActionBlockSyntax>(*node.action, alloc)
    );
}